

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O0

void If_ObjPerformMappingAnd(If_Man_t *p,If_Obj_t *pObj,int Mode,int fPreprocess,int fFirst)

{
  short sVar1;
  If_DsdMan_t *pIVar2;
  _func_int_If_Man_t_ptr_uint_ptr_int_int_char_ptr *p_Var3;
  char cVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  If_Cut_t *pIVar8;
  If_Set_t *pCutSet_00;
  abctime aVar9;
  word *pwVar10;
  uchar *pPerm;
  uint *puVar11;
  word t_00;
  uint uVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float local_16c;
  float local_168;
  float local_164;
  uint local_160;
  bool local_159;
  bool local_149;
  bool local_e7;
  float local_e4;
  float local_e0;
  float local_dc;
  bool local_c9;
  int truthId_2;
  int iCofVar;
  int truthId_1;
  int iDecMask;
  word Truth_1;
  uint TruthU_1;
  word Truth;
  uint TruthU;
  int truthId;
  abctime clk;
  int t_1;
  If_Cut_t *t;
  int fUseAndCut;
  int fSave0;
  int fChange;
  int iCutDsd;
  int v;
  int k;
  int i;
  int fFunc1R;
  int fFunc0R;
  If_Cut_t *pCut1R;
  If_Cut_t *pCut0R;
  If_Cut_t *pCut;
  If_Cut_t *pCut1;
  If_Cut_t *pCut0;
  If_Set_t *pCutSet;
  int fFirst_local;
  int fPreprocess_local;
  int Mode_local;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  local_c9 = true;
  if ((((((p->pPars->fDelayOpt == 0) && (local_c9 = true, p->pPars->fDelayOptLut == 0)) &&
        (local_c9 = true, p->pPars->fDsdBalance == 0)) &&
       ((local_c9 = true, p->pPars->fUserRecLib == 0 &&
        (local_c9 = true, p->pPars->fUseDsdTune == 0)))) &&
      (local_c9 = true, p->pPars->fUseCofVars == 0)) &&
     ((local_c9 = true, p->pPars->fUseAndVars == 0 && (local_c9 = true, p->pPars->fUse34Spec == 0)))
     ) {
    local_c9 = p->pPars->pLutStruct != (char *)0x0;
  }
  bVar14 = true;
  if (p->pPars->nAndDelay < 1) {
    bVar14 = 0 < p->pPars->nAndArea;
  }
  iVar5 = If_ObjIsAnd(pObj->pFanin0);
  if ((iVar5 != 0) && (pObj->pFanin0->pCutSet->nCuts < 1)) {
    __assert_fail("!If_ObjIsAnd(pObj->pFanin0) || pObj->pFanin0->pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                  ,0x68,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  iVar5 = If_ObjIsAnd(pObj->pFanin1);
  if ((iVar5 != 0) && (pObj->pFanin1->pCutSet->nCuts < 1)) {
    __assert_fail("!If_ObjIsAnd(pObj->pFanin1) || pObj->pFanin1->pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                  ,0x69,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  if (Mode == 0) {
    pObj->EstRefs = (float)pObj->nRefs;
  }
  else if (Mode == 1) {
    pObj->EstRefs = (pObj->EstRefs + pObj->EstRefs + (float)pObj->nRefs) / 3.0;
  }
  if ((Mode != 0) && (0 < pObj->nRefs)) {
    pIVar8 = If_ObjCutBest(pObj);
    If_CutAreaDeref(p,pIVar8);
  }
  pCutSet_00 = If_ManSetupNodeCutSet(p,pObj);
  pCut0R = If_ObjCutBest(pObj);
  if (fFirst == 0) {
    if (p->pPars->fDelayOpt == 0) {
      if (p->pPars->fDsdBalance == 0) {
        if (p->pPars->fUserRecLib == 0) {
          if (p->pPars->fDelayOptLut == 0) {
            if (p->pPars->nGateSize < 1) {
              fVar15 = If_CutDelay(p,pObj,pCut0R);
              pCut0R->Delay = fVar15;
            }
            else {
              iVar5 = If_CutDelaySop(p,pCut0R);
              pCut0R->Delay = (float)iVar5;
            }
          }
          else {
            iVar5 = If_CutLutBalanceEval(p,pCut0R);
            pCut0R->Delay = (float)iVar5;
          }
        }
        else {
          iVar5 = If_CutDelayRecCost3(p,pCut0R,pObj);
          pCut0R->Delay = (float)iVar5;
        }
      }
      else {
        iVar5 = If_CutDsdBalanceEval(p,pCut0R,(Vec_Int_t *)0x0);
        pCut0R->Delay = (float)iVar5;
      }
    }
    else {
      iVar5 = If_CutSopBalanceEval(p,pCut0R,(Vec_Int_t *)0x0);
      pCut0R->Delay = (float)iVar5;
    }
    if ((pCut0R->Delay == -1.0) && (!NAN(pCut0R->Delay))) {
      __assert_fail("pCut->Delay != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                    ,0x88,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
    }
    if (p->fEpsilon + p->fEpsilon + pObj->Required < pCut0R->Delay) {
      Abc_Print(1,
                "If_ObjPerformMappingAnd(): Warning! Delay of node %d (%f) exceeds the required times (%f).\n"
                ,(double)pCut0R->Delay,(double)(pObj->Required + p->fEpsilon),(ulong)(uint)pObj->Id)
      ;
    }
    if (Mode == 2) {
      local_dc = If_CutAreaDerefed(p,pCut0R);
    }
    else {
      local_dc = If_CutAreaFlow(p,pCut0R);
    }
    pCut0R->Area = local_dc;
    if (p->pPars->fEdge != 0) {
      if (Mode == 2) {
        local_e0 = If_CutEdgeDerefed(p,pCut0R);
      }
      else {
        local_e0 = If_CutEdgeFlow(p,pCut0R);
      }
      pCut0R->Edge = local_e0;
    }
    if (p->pPars->fPower != 0) {
      if (Mode == 2) {
        local_e4 = If_CutPowerDerefed(p,pCut0R,pObj);
      }
      else {
        local_e4 = If_CutPowerFlow(p,pCut0R,pObj);
      }
      pCut0R->Power = local_e4;
    }
    if (fPreprocess == 0) {
      sVar1 = pCutSet_00->nCuts;
      pCutSet_00->nCuts = sVar1 + 1;
      If_CutCopy(p,pCutSet_00->ppCuts[sVar1],pCut0R);
    }
  }
  v = 0;
  do {
    bVar13 = false;
    if (v < pObj->pFanin0->pCutSet->nCuts) {
      pCut1 = pObj->pFanin0->pCutSet->ppCuts[v];
      bVar13 = pCut1 != (If_Cut_t *)0x0;
    }
    if (!bVar13) {
      if (pCutSet_00->nCuts < 1) {
        __assert_fail("pCutSet->nCuts > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                      ,0x176,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
      }
      if ((fPreprocess == 0) || ((*pCutSet_00->ppCuts)->Delay <= pObj->Required + p->fEpsilon)) {
        pIVar8 = If_ObjCutBest(pObj);
        If_CutCopy(p,pIVar8,*pCutSet_00->ppCuts);
        if ((p->pPars->fUserRecLib != 0) &&
           ((pIVar8 = If_ObjCutBest(pObj), 0xffe < (*(uint *)&pIVar8->field_0x1c & 0xfff) ||
            (pIVar8 = If_ObjCutBest(pObj), 1e+09 < pIVar8->Delay || pIVar8->Delay == 1e+09)))) {
          __assert_fail("If_ObjCutBest(pObj)->Cost < IF_COST_MAX && If_ObjCutBest(pObj)->Delay < ABC_INFINITY"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                        ,0x17e,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                       );
        }
      }
      if (((*(uint *)pObj >> 0xc & 1) == 0) &&
         (pIVar8 = If_ObjCutBest(pObj), 1 < *(uint *)&pIVar8->field_0x1c >> 0x18)) {
        sVar1 = pCutSet_00->nCuts;
        pCutSet_00->nCuts = sVar1 + 1;
        If_ManSetupCutTriv(p,pCutSet_00->ppCuts[sVar1],pObj->Id);
        if (pCutSet_00->nCutsMax + 1 < (int)pCutSet_00->nCuts) {
          __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax+1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                        ,0x184,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                       );
        }
      }
      if ((Mode != 0) && (0 < pObj->nRefs)) {
        pIVar8 = If_ObjCutBest(pObj);
        If_CutAreaRef(p,pIVar8);
      }
      pIVar8 = If_ObjCutBest(pObj);
      if ((*(uint *)&pIVar8->field_0x1c >> 0xe & 1) != 0) {
        Abc_Print(1,"The best cut is useless.\n");
      }
      if (p->pPars->pFuncUser != (_func_int_If_Man_t_ptr_If_Obj_t_ptr_If_Cut_t_ptr *)0x0) {
        v = 0;
        while( true ) {
          bVar14 = false;
          if (v < pObj->pCutSet->nCuts) {
            pCut0R = pObj->pCutSet->ppCuts[v];
            bVar14 = pCut0R != (If_Cut_t *)0x0;
          }
          if (!bVar14) break;
          (*p->pPars->pFuncUser)(p,pObj,pCut0R);
          v = v + 1;
        }
      }
      If_ManDerefNodeCutSet(p,pObj);
      return;
    }
    iCutDsd = 0;
    while( true ) {
      bVar13 = false;
      if (iCutDsd < pObj->pFanin1->pCutSet->nCuts) {
        pCut = pObj->pFanin1->pCutSet->ppCuts[iCutDsd];
        bVar13 = pCut != (If_Cut_t *)0x0;
      }
      if (!bVar13) break;
      if (pCutSet_00->nCutsMax < pCutSet_00->nCuts) {
        __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                      ,0x9c,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
      }
      pCut0R = pCutSet_00->ppCuts[pCutSet_00->nCuts];
      iVar5 = If_WordCountOnes(pCut1->uSign | pCut->uSign);
      if (iVar5 <= p->pPars->nLutSize) {
        pCut1R = pCut1;
        _fFunc1R = pCut;
        i = pCut1->iCutFunc ^ *(uint *)&pCut1->field_0x1c >> 0xc & 1 ^ *(uint *)pObj >> 4 & 1;
        uVar6 = pCut->iCutFunc ^ *(uint *)&pCut->field_0x1c >> 0xc & 1 ^ *(uint *)pObj >> 5 & 1;
        k = uVar6;
        if (((p->pPars->fUseTtPerm != 0) &&
            (*(uint *)&pCut1->field_0x1c >> 0x18 <= *(uint *)&pCut->field_0x1c >> 0x18)) &&
           ((*(uint *)&pCut1->field_0x1c >> 0x18 != *(uint *)&pCut->field_0x1c >> 0x18 ||
            (i <= (int)uVar6)))) {
          pCut1R = pCut;
          _fFunc1R = pCut1;
          k = i;
          i = uVar6;
        }
        if (p->pPars->fUseTtPerm == 0) {
          iVar5 = If_CutMergeOrdered(p,pCut1,pCut,pCut0R);
        }
        else {
          iVar5 = If_CutMerge(p,pCut1R,_fFunc1R,pCut0R);
        }
        if ((iVar5 != 0) &&
           (((*(uint *)pObj >> 10 & 1) == 0 ||
            (*(uint *)&pCut0R->field_0x1c >> 0x18 != p->pPars->nLutSize)))) {
          p->nCutsMerged = p->nCutsMerged + 1;
          p->nCutsTotal = p->nCutsTotal + 1;
          if ((p->pPars->fSkipCutFilter != 0) ||
             (iVar5 = If_CutFilter(pCutSet_00,pCut0R,(uint)local_c9), iVar5 == 0)) {
            local_e7 = false;
            if (((bVar14) && (local_e7 = false, *(uint *)&pCut0R->field_0x1c >> 0x18 == 2)) &&
               (local_e7 = false, pCut0R[1].Area == (float)pObj->pFanin0->Id)) {
              local_e7 = pCut0R[1].Edge == (float)pObj->pFanin1->Id;
            }
            *(uint *)&pCut0R->field_0x1c =
                 *(uint *)&pCut0R->field_0x1c & 0xffff7fff | (uint)local_e7 << 0xf;
            pCut0R->iCutFunc = -1;
            *(uint *)&pCut0R->field_0x1c = *(uint *)&pCut0R->field_0x1c & 0xffffefff;
            if (p->pPars->fTruth != 0) {
              _TruthU = 0;
              if (p->pPars->fVerbose != 0) {
                _TruthU = Abc_Clock();
              }
              if (p->pPars->fUseTtPerm == 0) {
                fUseAndCut = If_CutComputeTruth(p,pCut0R,pCut1,pCut,*(uint *)pObj >> 4 & 1,
                                                *(uint *)pObj >> 5 & 1);
              }
              else {
                fUseAndCut = If_CutComputeTruthPerm(p,pCut0R,pCut1R,_fFunc1R,i,k);
              }
              if (p->pPars->fVerbose != 0) {
                aVar9 = Abc_Clock();
                p->timeCache[4] = (aVar9 - _TruthU) + p->timeCache[4];
              }
              if (((p->pPars->fSkipCutFilter == 0) && (fUseAndCut != 0)) &&
                 (iVar5 = If_CutFilter(pCutSet_00,pCut0R,(uint)local_c9), iVar5 != 0))
              goto LAB_0045c9d2;
              if (p->pPars->fUseDsd != 0) {
                iVar5 = Abc_Lit2Var(pCut0R->iCutFunc);
                iVar7 = Vec_IntSize(p->vTtDsds[*(uint *)&pCut0R->field_0x1c >> 0x18]);
                if ((iVar7 <= iVar5) ||
                   (iVar7 = Vec_IntEntry(p->vTtDsds[*(uint *)&pCut0R->field_0x1c >> 0x18],iVar5),
                   iVar7 == -1)) {
                  while (iVar7 = Vec_IntSize(p->vTtDsds[*(uint *)&pCut0R->field_0x1c >> 0x18]),
                        iVar7 <= iVar5) {
                    Vec_IntPush(p->vTtDsds[*(uint *)&pCut0R->field_0x1c >> 0x18],-1);
                    for (fChange = 0; iVar7 = Abc_MaxInt(6,*(uint *)&pCut0R->field_0x1c >> 0x18),
                        fChange < iVar7; fChange = fChange + 1) {
                      Vec_StrPush(p->vTtPerms[*(uint *)&pCut0R->field_0x1c >> 0x18],'x');
                    }
                  }
                  pIVar2 = p->pIfDsdMan;
                  pwVar10 = If_CutTruthWR(p,pCut0R);
                  uVar6 = *(uint *)&pCut0R->field_0x1c;
                  pPerm = (uchar *)If_CutDsdPerm(p,pCut0R);
                  iVar7 = If_DsdManCompute(pIVar2,pwVar10,uVar6 >> 0x18,pPerm,p->pPars->pLutStruct);
                  Vec_IntWriteEntry(p->vTtDsds[*(uint *)&pCut0R->field_0x1c >> 0x18],iVar5,iVar7);
                }
                pIVar2 = p->pIfDsdMan;
                iVar5 = If_CutDsdLit(p,pCut0R);
                uVar6 = If_DsdManSuppSize(pIVar2,iVar5);
                if (uVar6 != *(uint *)&pCut0R->field_0x1c >> 0x18) {
                  __assert_fail("If_DsdManSuppSize(p->pIfDsdMan, If_CutDsdLit(p, pCut)) == (int)pCut->nLeaves"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                                ,0xe5,
                                "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                               );
                }
              }
              *(uint *)&pCut0R->field_0x1c = *(uint *)&pCut0R->field_0x1c & 0xffffbfff;
              if (p->pPars->pFuncCell == (_func_int_If_Man_t_ptr_uint_ptr_int_int_char_ptr *)0x0) {
                if (p->pPars->fUseDsdTune == 0) {
                  if (p->pPars->fUse34Spec == 0) {
                    if (p->pPars->fUseAndVars != 0) {
                      iVar5 = Abc_Lit2Var(pCut0R->iCutFunc);
                      if (0xd < p->pPars->nLutSize) {
                        __assert_fail("p->pPars->nLutSize <= 13",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                                      ,0x121,
                                      "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                     );
                      }
                      iVar7 = Vec_IntSize(p->vTtDecs[*(uint *)&pCut0R->field_0x1c >> 0x18]);
                      if ((iVar7 <= iVar5) ||
                         (iVar7 = Vec_IntEntry(p->vTtDecs[*(uint *)&pCut0R->field_0x1c >> 0x18],
                                               iVar5), iVar7 == -1)) {
                        while (iVar7 = Vec_IntSize(p->vTtDecs[*(uint *)&pCut0R->field_0x1c >> 0x18])
                              , iVar7 <= iVar5) {
                          Vec_IntPush(p->vTtDecs[*(uint *)&pCut0R->field_0x1c >> 0x18],-1);
                        }
                        if ((p->pPars->nLutSize / 2 < (int)(*(uint *)&pCut0R->field_0x1c >> 0x18))
                           && (uVar6 = *(uint *)&pCut0R->field_0x1c >> 0x18,
                              iVar7 = p->pPars->nLutSize / 2, uVar12 = iVar7 * 2,
                              uVar6 == uVar12 ||
                              SBORROW4(uVar6,uVar12) != (int)(uVar6 + iVar7 * -2) < 0)) {
                          pwVar10 = If_CutTruthWR(p,pCut0R);
                          iCofVar = Abc_TtProcessBiDec(pwVar10,*(uint *)&pCut0R->field_0x1c >> 0x18,
                                                       p->pPars->nLutSize / 2);
                        }
                        else {
                          iCofVar = 0;
                        }
                        Vec_IntWriteEntry(p->vTtDecs[*(uint *)&pCut0R->field_0x1c >> 0x18],iVar5,
                                          iCofVar);
                      }
                      iVar5 = Vec_IntEntry(p->vTtDecs[*(uint *)&pCut0R->field_0x1c >> 0x18],iVar5);
                      if (iVar5 < 0) {
                        __assert_fail("iDecMask >= 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                                      ,0x12d,
                                      "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                     );
                      }
                      local_149 = false;
                      if (iVar5 == 0) {
                        local_149 = p->pPars->nLutSize / 2 <
                                    (int)(*(uint *)&pCut0R->field_0x1c >> 0x18);
                      }
                      *(uint *)&pCut0R->field_0x1c =
                           *(uint *)&pCut0R->field_0x1c & 0xffffbfff | (uint)local_149 << 0xe;
                      p->nCutsUselessAll =
                           (*(uint *)&pCut0R->field_0x1c >> 0xe & 1) + p->nCutsUselessAll;
                      uVar6 = *(uint *)&pCut0R->field_0x1c >> 0x18;
                      p->nCutsUseless[uVar6] =
                           (*(uint *)&pCut0R->field_0x1c >> 0xe & 1) + p->nCutsUseless[uVar6];
                      p->nCutsCountAll = p->nCutsCountAll + 1;
                      uVar6 = *(uint *)&pCut0R->field_0x1c >> 0x18;
                      p->nCutsCount[uVar6] = p->nCutsCount[uVar6] + 1;
                    }
                    if ((p->pPars->fUseCofVars != 0) &&
                       ((p->pPars->fUseAndVars == 0 ||
                        ((*(uint *)&pCut0R->field_0x1c >> 0xe & 1) != 0)))) {
                      iVar5 = Abc_Lit2Var(pCut0R->iCutFunc);
                      iVar7 = Vec_StrSize(p->vTtVars[*(uint *)&pCut0R->field_0x1c >> 0x18]);
                      if ((iVar7 <= iVar5) ||
                         (cVar4 = Vec_StrEntry(p->vTtVars[*(uint *)&pCut0R->field_0x1c >> 0x18],
                                               iVar5), cVar4 == -1)) {
                        while (iVar7 = Vec_StrSize(p->vTtVars[*(uint *)&pCut0R->field_0x1c >> 0x18])
                              , iVar7 <= iVar5) {
                          Vec_StrPush(p->vTtVars[*(uint *)&pCut0R->field_0x1c >> 0x18],-1);
                        }
                        pwVar10 = If_CutTruthWR(p,pCut0R);
                        iVar7 = Abc_TtCheckCondDep(pwVar10,*(uint *)&pCut0R->field_0x1c >> 0x18,
                                                   p->pPars->nLutSize / 2);
                        Vec_StrWriteEntry(p->vTtVars[*(uint *)&pCut0R->field_0x1c >> 0x18],iVar5,
                                          (char)iVar7);
                      }
                      cVar4 = Vec_StrEntry(p->vTtVars[*(uint *)&pCut0R->field_0x1c >> 0x18],iVar5);
                      uVar6 = (uint)cVar4;
                      if (((int)uVar6 < 0) ||
                         ((int)(*(uint *)&pCut0R->field_0x1c >> 0x18) < (int)uVar6)) {
                        __assert_fail("iCofVar >= 0 && iCofVar <= (int)pCut->nLeaves",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                                      ,0x13f,
                                      "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                     );
                      }
                      local_159 = false;
                      if (uVar6 == *(uint *)&pCut0R->field_0x1c >> 0x18) {
                        local_159 = *(uint *)&pCut0R->field_0x1c >> 0x18 != 0;
                      }
                      *(uint *)&pCut0R->field_0x1c =
                           *(uint *)&pCut0R->field_0x1c & 0xffffbfff | (uint)local_159 << 0xe;
                      p->nCutsUselessAll =
                           (*(uint *)&pCut0R->field_0x1c >> 0xe & 1) + p->nCutsUselessAll;
                      uVar6 = *(uint *)&pCut0R->field_0x1c >> 0x18;
                      p->nCutsUseless[uVar6] =
                           (*(uint *)&pCut0R->field_0x1c >> 0xe & 1) + p->nCutsUseless[uVar6];
                      p->nCutsCountAll = p->nCutsCountAll + 1;
                      uVar6 = *(uint *)&pCut0R->field_0x1c >> 0x18;
                      p->nCutsCount[uVar6] = p->nCutsCount[uVar6] + 1;
                    }
                  }
                  else {
                    if (4 < *(uint *)&pCut0R->field_0x1c >> 0x18) {
                      __assert_fail("pCut->nLeaves <= 4",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                                    ,0x118,
                                    "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                   );
                    }
                    if (*(uint *)&pCut0R->field_0x1c >> 0x18 == 4) {
                      puVar11 = If_CutTruth(p,pCut0R);
                      iVar5 = Abc_Tt4Check(*puVar11 & 0xffff);
                      if (iVar5 == 0) {
                        *(uint *)&pCut0R->field_0x1c =
                             *(uint *)&pCut0R->field_0x1c & 0xffffbfff | 0x4000;
                      }
                    }
                  }
                }
                else {
                  pIVar2 = p->pIfDsdMan;
                  iVar5 = If_CutDsdLit(p,pCut0R);
                  uVar6 = If_DsdManReadMark(pIVar2,iVar5);
                  *(uint *)&pCut0R->field_0x1c =
                       *(uint *)&pCut0R->field_0x1c & 0xffffbfff | (uVar6 & 1) << 0xe;
                  p->nCutsUselessAll =
                       (*(uint *)&pCut0R->field_0x1c >> 0xe & 1) + p->nCutsUselessAll;
                  uVar6 = *(uint *)&pCut0R->field_0x1c >> 0x18;
                  p->nCutsUseless[uVar6] =
                       (*(uint *)&pCut0R->field_0x1c >> 0xe & 1) + p->nCutsUseless[uVar6];
                  p->nCutsCountAll = p->nCutsCountAll + 1;
                  uVar6 = *(uint *)&pCut0R->field_0x1c >> 0x18;
                  p->nCutsCount[uVar6] = p->nCutsCount[uVar6] + 1;
                }
              }
              else {
                if (p->pPars->fUseTtPerm != 0) {
                  __assert_fail("p->pPars->fUseTtPerm == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                                ,0xec,
                                "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                               );
                }
                if (((*(uint *)&pCut0R->field_0x1c >> 0x10 & 0xff) < 4) ||
                   (0x10 < (*(uint *)&pCut0R->field_0x1c >> 0x10 & 0xff))) {
                  __assert_fail("pCut->nLimit >= 4 && pCut->nLimit <= 16",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifMap.c"
                                ,0xed,
                                "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                               );
                }
                if (p->pPars->fUseDsd == 0) {
                  p_Var3 = p->pPars->pFuncCell;
                  puVar11 = If_CutTruth(p,pCut0R);
                  iVar5 = Abc_MaxInt(6,*(uint *)&pCut0R->field_0x1c >> 0x18);
                  iVar5 = (*p_Var3)(p,puVar11,iVar5,*(uint *)&pCut0R->field_0x1c >> 0x18,
                                    p->pPars->pLutStruct);
                  *(uint *)&pCut0R->field_0x1c =
                       *(uint *)&pCut0R->field_0x1c & 0xffffbfff | (uint)(iVar5 == 0) << 0xe;
                }
                else {
                  pIVar2 = p->pIfDsdMan;
                  iVar5 = If_CutDsdLit(p,pCut0R);
                  uVar6 = If_DsdManCheckDec(pIVar2,iVar5);
                  *(uint *)&pCut0R->field_0x1c =
                       *(uint *)&pCut0R->field_0x1c & 0xffffbfff | (uVar6 & 1) << 0xe;
                }
                p->nCutsUselessAll = (*(uint *)&pCut0R->field_0x1c >> 0xe & 1) + p->nCutsUselessAll;
                uVar6 = *(uint *)&pCut0R->field_0x1c >> 0x18;
                p->nCutsUseless[uVar6] =
                     (*(uint *)&pCut0R->field_0x1c >> 0xe & 1) + p->nCutsUseless[uVar6];
                p->nCutsCountAll = p->nCutsCountAll + 1;
                uVar6 = *(uint *)&pCut0R->field_0x1c >> 0x18;
                p->nCutsCount[uVar6] = p->nCutsCount[uVar6] + 1;
                if ((((p->pPars->fEnableCheck75 == 0) && (p->pPars->fEnableCheck75u == 0)) ||
                    (*(uint *)&pCut0R->field_0x1c >> 0x18 != 5)) ||
                   ((*(uint *)&pCut0R->field_0x1c >> 0x10 & 0xff) != 5)) {
                  if ((p->pPars->fVerbose != 0) && (*(uint *)&pCut0R->field_0x1c >> 0x18 == 5)) {
                    puVar11 = If_CutTruth(p,pCut0R);
                    t_00 = CONCAT44(*puVar11,*puVar11);
                    p->nCuts5 = p->nCuts5 + 1;
                    iVar5 = If_CluCheckDecInAny(t_00,5);
                    if ((iVar5 != 0) || (iVar5 = If_CluCheckDecOut(t_00,5), iVar5 != 0)) {
                      p->nCuts5a = p->nCuts5a + 1;
                    }
                  }
                }
                else {
                  puVar11 = If_CutTruth(p,pCut0R);
                  uVar6 = *puVar11;
                  p->nCuts5 = p->nCuts5 + 1;
                  iVar5 = If_CluCheckDecInAny(CONCAT44(uVar6,uVar6),5);
                  if (iVar5 == 0) goto LAB_0045c9d2;
                  p->nCuts5a = p->nCuts5a + 1;
                }
              }
            }
            *(uint *)&pCut0R->field_0x1c =
                 *(uint *)&pCut0R->field_0x1c & 0xffffdfff |
                 (uint)(p->pPars->pFuncCost != (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0) << 0xd;
            if (p->pPars->pFuncCost == (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0) {
              local_160 = 0;
            }
            else {
              local_160 = (*p->pPars->pFuncCost)(p,pCut0R);
            }
            *(uint *)&pCut0R->field_0x1c =
                 *(uint *)&pCut0R->field_0x1c & 0xfffff000 | local_160 & 0xfff;
            if ((*(uint *)&pCut0R->field_0x1c & 0xfff) != 0xfff) {
              if (p->pPars->fDelayOpt == 0) {
                if (p->pPars->fDsdBalance == 0) {
                  if (p->pPars->fUserRecLib == 0) {
                    if (p->pPars->fDelayOptLut == 0) {
                      if (p->pPars->nGateSize < 1) {
                        fVar15 = If_CutDelay(p,pObj,pCut0R);
                        pCut0R->Delay = fVar15;
                      }
                      else {
                        iVar5 = If_CutDelaySop(p,pCut0R);
                        pCut0R->Delay = (float)iVar5;
                      }
                    }
                    else {
                      iVar5 = If_CutLutBalanceEval(p,pCut0R);
                      pCut0R->Delay = (float)iVar5;
                    }
                  }
                  else {
                    iVar5 = If_CutDelayRecCost3(p,pCut0R,pObj);
                    pCut0R->Delay = (float)iVar5;
                  }
                }
                else {
                  iVar5 = If_CutDsdBalanceEval(p,pCut0R,(Vec_Int_t *)0x0);
                  pCut0R->Delay = (float)iVar5;
                }
              }
              else {
                iVar5 = If_CutSopBalanceEval(p,pCut0R,(Vec_Int_t *)0x0);
                pCut0R->Delay = (float)iVar5;
              }
              if (((pCut0R->Delay != -1.0) || (NAN(pCut0R->Delay))) &&
                 ((Mode == 0 || (pCut0R->Delay <= pObj->Required + p->fEpsilon)))) {
                if (Mode == 2) {
                  local_164 = If_CutAreaDerefed(p,pCut0R);
                }
                else {
                  local_164 = If_CutAreaFlow(p,pCut0R);
                }
                pCut0R->Area = local_164;
                if (p->pPars->fEdge != 0) {
                  if (Mode == 2) {
                    local_168 = If_CutEdgeDerefed(p,pCut0R);
                  }
                  else {
                    local_168 = If_CutEdgeFlow(p,pCut0R);
                  }
                  pCut0R->Edge = local_168;
                }
                if (p->pPars->fPower != 0) {
                  if (Mode == 2) {
                    local_16c = If_CutPowerDerefed(p,pCut0R,pObj);
                  }
                  else {
                    local_16c = If_CutPowerFlow(p,pCut0R,pObj);
                  }
                  pCut0R->Power = local_16c;
                }
                If_CutSort(p,pCutSet_00,pCut0R);
              }
            }
          }
        }
      }
LAB_0045c9d2:
      iCutDsd = iCutDsd + 1;
    }
    v = v + 1;
  } while( true );
}

Assistant:

void If_ObjPerformMappingAnd( If_Man_t * p, If_Obj_t * pObj, int Mode, int fPreprocess, int fFirst )
{
    If_Set_t * pCutSet;
    If_Cut_t * pCut0, * pCut1, * pCut;
    If_Cut_t * pCut0R, * pCut1R;
    int fFunc0R, fFunc1R;
    int i, k, v, iCutDsd, fChange;
    int fSave0 = p->pPars->fDelayOpt || p->pPars->fDelayOptLut || p->pPars->fDsdBalance || p->pPars->fUserRecLib || p->pPars->fUseDsdTune || p->pPars->fUseCofVars || p->pPars->fUseAndVars || p->pPars->fUse34Spec || p->pPars->pLutStruct != NULL;
    int fUseAndCut = (p->pPars->nAndDelay > 0) || (p->pPars->nAndArea > 0);
    assert( !If_ObjIsAnd(pObj->pFanin0) || pObj->pFanin0->pCutSet->nCuts > 0 );
    assert( !If_ObjIsAnd(pObj->pFanin1) || pObj->pFanin1->pCutSet->nCuts > 0 );

    // prepare
    if ( Mode == 0 )
        pObj->EstRefs = (float)pObj->nRefs;
    else if ( Mode == 1 )
        pObj->EstRefs = (float)((2.0 * pObj->EstRefs + pObj->nRefs) / 3.0);
    // deref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaDeref( p, If_ObjCutBest(pObj) );

    // prepare the cutset
    pCutSet = If_ManSetupNodeCutSet( p, pObj );

    // get the current assigned best cut
    pCut = If_ObjCutBest(pObj);
    if ( !fFirst )
    {
        // recompute the parameters of the best cut
        if ( p->pPars->fDelayOpt )
            pCut->Delay = If_CutSopBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fDsdBalance )
            pCut->Delay = If_CutDsdBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fUserRecLib )
            pCut->Delay = If_CutDelayRecCost3( p, pCut, pObj ); 
        else if ( p->pPars->fDelayOptLut )
            pCut->Delay = If_CutLutBalanceEval( p, pCut );
        else if( p->pPars->nGateSize > 0 )
            pCut->Delay = If_CutDelaySop( p, pCut );
        else
            pCut->Delay = If_CutDelay( p, pObj, pCut );
        assert( pCut->Delay != -1 );
//        assert( pCut->Delay <= pObj->Required + p->fEpsilon );
        if ( pCut->Delay > pObj->Required + 2*p->fEpsilon )
            Abc_Print( 1, "If_ObjPerformMappingAnd(): Warning! Delay of node %d (%f) exceeds the required times (%f).\n", 
                pObj->Id, pCut->Delay, pObj->Required + p->fEpsilon );
        pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
        if ( p->pPars->fEdge )
            pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
        if ( p->pPars->fPower )
            pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
        // save the best cut from the previous iteration
        if ( !fPreprocess )
            If_CutCopy( p, pCutSet->ppCuts[pCutSet->nCuts++], pCut );
    }

    // generate cuts
    If_ObjForEachCut( pObj->pFanin0, pCut0, i )
    If_ObjForEachCut( pObj->pFanin1, pCut1, k )
    {
        // get the next free cut
        assert( pCutSet->nCuts <= pCutSet->nCutsMax );
        pCut = pCutSet->ppCuts[pCutSet->nCuts];
        // make sure K-feasible cut exists
        if ( If_WordCountOnes(pCut0->uSign | pCut1->uSign) > p->pPars->nLutSize )
            continue;

        pCut0R = pCut0;
        pCut1R = pCut1;
        fFunc0R = pCut0->iCutFunc ^ pCut0->fCompl ^ pObj->fCompl0;
        fFunc1R = pCut1->iCutFunc ^ pCut1->fCompl ^ pObj->fCompl1;
        if ( !p->pPars->fUseTtPerm || pCut0->nLeaves > pCut1->nLeaves || (pCut0->nLeaves == pCut1->nLeaves && fFunc0R > fFunc1R) )
        {
        }
        else
        {
            ABC_SWAP( If_Cut_t *, pCut0R, pCut1R );
            ABC_SWAP( int, fFunc0R, fFunc1R );
        }        

        // merge the cuts
        if ( p->pPars->fUseTtPerm )
        {
            if ( !If_CutMerge( p, pCut0R, pCut1R, pCut ) )
                continue;
        }
        else
        {
            if ( !If_CutMergeOrdered( p, pCut0, pCut1, pCut ) )
                continue;
        }
        if ( pObj->fSpec && pCut->nLeaves == (unsigned)p->pPars->nLutSize )
            continue;
        p->nCutsMerged++;
        p->nCutsTotal++;
        // check if this cut is contained in any of the available cuts
        if ( !p->pPars->fSkipCutFilter && If_CutFilter( pCutSet, pCut, fSave0 ) )
            continue;
        // check if the cut is a special AND-gate cut
        pCut->fAndCut = fUseAndCut && pCut->nLeaves == 2 && pCut->pLeaves[0] == pObj->pFanin0->Id && pCut->pLeaves[1] == pObj->pFanin1->Id;
        //assert( pCut->nLeaves != 2 || pCut->pLeaves[0] < pCut->pLeaves[1] );
        //assert( pCut->nLeaves != 2 || pObj->pFanin0->Id < pObj->pFanin1->Id );
        // compute the truth table
        pCut->iCutFunc = -1;
        pCut->fCompl = 0;
        if ( p->pPars->fTruth )
        {
//            int nShared = pCut0->nLeaves + pCut1->nLeaves - pCut->nLeaves;
            abctime clk = 0;
            if ( p->pPars->fVerbose )
                clk = Abc_Clock();
            if ( p->pPars->fUseTtPerm )
                fChange = If_CutComputeTruthPerm( p, pCut, pCut0R, pCut1R, fFunc0R, fFunc1R );
            else
                fChange = If_CutComputeTruth( p, pCut, pCut0, pCut1, pObj->fCompl0, pObj->fCompl1 );
            if ( p->pPars->fVerbose )
                p->timeCache[4] += Abc_Clock() - clk;
            if ( !p->pPars->fSkipCutFilter && fChange && If_CutFilter( pCutSet, pCut, fSave0 ) )
                continue;
            if ( p->pPars->fUseDsd )
            {
                extern void If_ManCacheRecord( If_Man_t * p, int iDsd0, int iDsd1, int nShared, int iDsd );
                int truthId = Abc_Lit2Var(pCut->iCutFunc);
                if ( truthId >= Vec_IntSize(p->vTtDsds[pCut->nLeaves]) || Vec_IntEntry(p->vTtDsds[pCut->nLeaves], truthId) == -1 )
                {
                    while ( truthId >= Vec_IntSize(p->vTtDsds[pCut->nLeaves]) )
                    {
                        Vec_IntPush( p->vTtDsds[pCut->nLeaves], -1 );
                        for ( v = 0; v < Abc_MaxInt(6, pCut->nLeaves); v++ )
                            Vec_StrPush( p->vTtPerms[pCut->nLeaves], IF_BIG_CHAR );
                    }
                    iCutDsd = If_DsdManCompute( p->pIfDsdMan, If_CutTruthWR(p, pCut), pCut->nLeaves, (unsigned char *)If_CutDsdPerm(p, pCut), p->pPars->pLutStruct );
                    Vec_IntWriteEntry( p->vTtDsds[pCut->nLeaves], truthId, iCutDsd );
                }
                assert( If_DsdManSuppSize(p->pIfDsdMan, If_CutDsdLit(p, pCut)) == (int)pCut->nLeaves );
                //If_ManCacheRecord( p, If_CutDsdLit(p, pCut0), If_CutDsdLit(p, pCut1), nShared, If_CutDsdLit(p, pCut) );
            }
            // run user functions
            pCut->fUseless = 0;
            if ( p->pPars->pFuncCell )
            {
                assert( p->pPars->fUseTtPerm == 0 );
                assert( pCut->nLimit >= 4 && pCut->nLimit <= 16 );
                if ( p->pPars->fUseDsd )
                    pCut->fUseless = If_DsdManCheckDec( p->pIfDsdMan, If_CutDsdLit(p, pCut) );
                else
                    pCut->fUseless = !p->pPars->pFuncCell( p, If_CutTruth(p, pCut), Abc_MaxInt(6, pCut->nLeaves), pCut->nLeaves, p->pPars->pLutStruct );
                p->nCutsUselessAll += pCut->fUseless;
                p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                p->nCutsCountAll++;
                p->nCutsCount[pCut->nLeaves]++;
                // skip 5-input cuts, which cannot be decomposed
                if ( (p->pPars->fEnableCheck75 || p->pPars->fEnableCheck75u) && pCut->nLeaves == 5 && pCut->nLimit == 5 )
                {
                    extern int If_CluCheckDecInAny( word t, int nVars );
                    extern int If_CluCheckDecOut( word t, int nVars );
                    unsigned TruthU = *If_CutTruth(p, pCut);
                    word Truth = (((word)TruthU << 32) | (word)TruthU);
                    p->nCuts5++;
                    if ( If_CluCheckDecInAny( Truth, 5 ) )
                        p->nCuts5a++;
                    else
                        continue;
                }
                else if ( p->pPars->fVerbose && pCut->nLeaves == 5 )
                {
                    extern int If_CluCheckDecInAny( word t, int nVars );
                    extern int If_CluCheckDecOut( word t, int nVars );
                    unsigned TruthU = *If_CutTruth(p, pCut);
                    word Truth = (((word)TruthU << 32) | (word)TruthU);
                    p->nCuts5++;
                    if ( If_CluCheckDecInAny( Truth, 5 ) || If_CluCheckDecOut( Truth, 5 ) )
                        p->nCuts5a++;
                }
            }
            else if ( p->pPars->fUseDsdTune )
            {
                pCut->fUseless = If_DsdManReadMark( p->pIfDsdMan, If_CutDsdLit(p, pCut) );
                p->nCutsUselessAll += pCut->fUseless;
                p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                p->nCutsCountAll++;
                p->nCutsCount[pCut->nLeaves]++;
            }
            else if ( p->pPars->fUse34Spec )
            {
                assert( pCut->nLeaves <= 4 );
                if ( pCut->nLeaves == 4 && !Abc_Tt4Check( (int)(0xFFFF & *If_CutTruth(p, pCut)) ) )
                    pCut->fUseless = 1;
            }
            else 
            {
                if ( p->pPars->fUseAndVars )
                {
                    int iDecMask = -1, truthId = Abc_Lit2Var(pCut->iCutFunc);
                    assert( p->pPars->nLutSize <= 13 );
                    if ( truthId >= Vec_IntSize(p->vTtDecs[pCut->nLeaves]) || Vec_IntEntry(p->vTtDecs[pCut->nLeaves], truthId) == -1 )
                    {
                        while ( truthId >= Vec_IntSize(p->vTtDecs[pCut->nLeaves]) )
                            Vec_IntPush( p->vTtDecs[pCut->nLeaves], -1 );
                        if ( (int)pCut->nLeaves > p->pPars->nLutSize / 2 && (int)pCut->nLeaves <= 2 * (p->pPars->nLutSize / 2) )
                            iDecMask = Abc_TtProcessBiDec( If_CutTruthWR(p, pCut), (int)pCut->nLeaves, p->pPars->nLutSize / 2 );
                        else
                            iDecMask = 0;
                        Vec_IntWriteEntry( p->vTtDecs[pCut->nLeaves], truthId, iDecMask );
                    }
                    iDecMask = Vec_IntEntry(p->vTtDecs[pCut->nLeaves], truthId);
                    assert( iDecMask >= 0 );
                    pCut->fUseless = (int)(iDecMask == 0 && (int)pCut->nLeaves > p->pPars->nLutSize / 2);
                    p->nCutsUselessAll += pCut->fUseless;
                    p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                    p->nCutsCountAll++;
                    p->nCutsCount[pCut->nLeaves]++;
                }
                if ( p->pPars->fUseCofVars && (!p->pPars->fUseAndVars || pCut->fUseless) )
                {
                    int iCofVar = -1, truthId = Abc_Lit2Var(pCut->iCutFunc);
                    if ( truthId >= Vec_StrSize(p->vTtVars[pCut->nLeaves]) || Vec_StrEntry(p->vTtVars[pCut->nLeaves], truthId) == (char)-1 )
                    {
                        while ( truthId >= Vec_StrSize(p->vTtVars[pCut->nLeaves]) )
                            Vec_StrPush( p->vTtVars[pCut->nLeaves], (char)-1 );
                        iCofVar = Abc_TtCheckCondDep( If_CutTruthWR(p, pCut), pCut->nLeaves, p->pPars->nLutSize / 2 );
                        Vec_StrWriteEntry( p->vTtVars[pCut->nLeaves], truthId, (char)iCofVar );
                    }
                    iCofVar = Vec_StrEntry(p->vTtVars[pCut->nLeaves], truthId);
                    assert( iCofVar >= 0 && iCofVar <= (int)pCut->nLeaves );
                    pCut->fUseless = (int)(iCofVar == (int)pCut->nLeaves && pCut->nLeaves > 0);
                    p->nCutsUselessAll += pCut->fUseless;
                    p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                    p->nCutsCountAll++;
                    p->nCutsCount[pCut->nLeaves]++;
                }
            }
        }
        
        // compute the application-specific cost and depth
        pCut->fUser = (p->pPars->pFuncCost != NULL);
        pCut->Cost = p->pPars->pFuncCost? p->pPars->pFuncCost(p, pCut) : 0;
        if ( pCut->Cost == IF_COST_MAX )
            continue;
        // check if the cut satisfies the required times
        if ( p->pPars->fDelayOpt )
        {
            pCut->Delay = If_CutSopBalanceEval( p, pCut, NULL );
//            if ( pCut->Delay >= pObj->Level && pCut->nLeaves > 2 )
//                pCut->Delay += 1;
        }
        else if ( p->pPars->fDsdBalance )
        {
            pCut->Delay = If_CutDsdBalanceEval( p, pCut, NULL );
//            if ( pCut->Delay >= pObj->Level && pCut->nLeaves > 2 )
//                pCut->Delay += 1;
        }
        else if ( p->pPars->fUserRecLib )
        {
            pCut->Delay = If_CutDelayRecCost3( p, pCut, pObj ); 
//            if ( pCut->Delay >= pObj->Level && pCut->nLeaves > 2 )
//                pCut->Delay += 1;
        }
        else if ( p->pPars->fDelayOptLut )
            pCut->Delay = If_CutLutBalanceEval( p, pCut );
        else if( p->pPars->nGateSize > 0 )
            pCut->Delay = If_CutDelaySop( p, pCut );
        else 
            pCut->Delay = If_CutDelay( p, pObj, pCut );
        if ( pCut->Delay == -1 )
            continue;
        if ( Mode && pCut->Delay > pObj->Required + p->fEpsilon )
            continue;
        // compute area of the cut (this area may depend on the application specific cost)
        pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
        if ( p->pPars->fEdge )
            pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
        if ( p->pPars->fPower )
            pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
//        pCut->AveRefs = (Mode == 0)? (float)0.0 : If_CutAverageRefs( p, pCut );
        // insert the cut into storage
        If_CutSort( p, pCutSet, pCut );
//        If_CutTraverse( p, pObj, pCut );
    } 
    assert( pCutSet->nCuts > 0 );
//    If_CutVerifyCuts( pCutSet, !p->pPars->fUseTtPerm );

    // update the best cut
    if ( !fPreprocess || pCutSet->ppCuts[0]->Delay <= pObj->Required + p->fEpsilon )
    {
        If_CutCopy( p, If_ObjCutBest(pObj), pCutSet->ppCuts[0] );
        if(p->pPars->fUserRecLib)
            assert(If_ObjCutBest(pObj)->Cost < IF_COST_MAX && If_ObjCutBest(pObj)->Delay < ABC_INFINITY);
    }
    // add the trivial cut to the set
    if ( !pObj->fSkipCut && If_ObjCutBest(pObj)->nLeaves > 1 )
    {
        If_ManSetupCutTriv( p, pCutSet->ppCuts[pCutSet->nCuts++], pObj->Id );
        assert( pCutSet->nCuts <= pCutSet->nCutsMax+1 );
    }
//    if ( If_ObjCutBest(pObj)->nLeaves == 0 )
//        p->nBestCutSmall[0]++;
//    else if ( If_ObjCutBest(pObj)->nLeaves == 1 )
//        p->nBestCutSmall[1]++;

    // ref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaRef( p, If_ObjCutBest(pObj) );
    if ( If_ObjCutBest(pObj)->fUseless )
        Abc_Print( 1, "The best cut is useless.\n" );
    // call the user specified function for each cut
    if ( p->pPars->pFuncUser )
        If_ObjForEachCut( pObj, pCut, i )
            p->pPars->pFuncUser( p, pObj, pCut );
    // free the cuts
    If_ManDerefNodeCutSet( p, pObj );
}